

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jctrans.c
# Opt level: O1

void jpeg_copy_critical_parameters(j_decompress_ptr srcinfo,j_compress_ptr dstinfo)

{
  uint uVar1;
  jpeg_error_mgr *pjVar2;
  int iVar3;
  JQUANT_TBL *pJVar4;
  long lVar5;
  jpeg_component_info *pjVar6;
  JQUANT_TBL *pJVar7;
  jpeg_component_info *pjVar8;
  long lVar9;
  byte bVar10;
  
  bVar10 = 0;
  iVar3 = dstinfo->global_state;
  if (iVar3 != 100) {
    pjVar2 = dstinfo->err;
    pjVar2->msg_code = 0x15;
    (pjVar2->msg_parm).i[0] = iVar3;
    (*dstinfo->err->error_exit)((j_common_ptr)dstinfo);
  }
  dstinfo->image_width = srcinfo->image_width;
  dstinfo->image_height = srcinfo->image_height;
  dstinfo->input_components = srcinfo->num_components;
  dstinfo->in_color_space = srcinfo->jpeg_color_space;
  dstinfo->jpeg_width = srcinfo->output_width;
  dstinfo->jpeg_height = srcinfo->output_height;
  dstinfo->min_DCT_h_scaled_size = srcinfo->min_DCT_h_scaled_size;
  dstinfo->min_DCT_v_scaled_size = srcinfo->min_DCT_v_scaled_size;
  jpeg_set_defaults(dstinfo);
  jpeg_set_colorspace(dstinfo,srcinfo->jpeg_color_space);
  dstinfo->data_precision = srcinfo->data_precision;
  dstinfo->CCIR601_sampling = srcinfo->CCIR601_sampling;
  lVar9 = 0xe;
  do {
    if (srcinfo->quant_tbl_ptrs[lVar9 + -0xe] != (JQUANT_TBL *)0x0) {
      if (dstinfo->quant_tbl_ptrs[lVar9 + -0xe] == (JQUANT_TBL *)0x0) {
        pJVar4 = jpeg_alloc_quant_table((j_common_ptr)dstinfo);
        dstinfo->quant_tbl_ptrs[lVar9 + -0xe] = pJVar4;
      }
      pJVar4 = srcinfo->quant_tbl_ptrs[lVar9 + -0xe];
      pJVar7 = dstinfo->quant_tbl_ptrs[lVar9 + -0xe];
      for (lVar5 = 0x20; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(undefined4 *)pJVar7->quantval = *(undefined4 *)pJVar4->quantval;
        pJVar4 = (JQUANT_TBL *)((long)pJVar4 + ((ulong)bVar10 * -2 + 1) * 4);
        pJVar7 = (JQUANT_TBL *)((long)pJVar7 + ((ulong)bVar10 * -2 + 1) * 4);
      }
      dstinfo->quant_tbl_ptrs[lVar9 + -0xe]->sent_table = 0;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x12);
  iVar3 = srcinfo->num_components;
  dstinfo->num_components = iVar3;
  if (iVar3 - 0xbU < 0xfffffff6) {
    pjVar2 = dstinfo->err;
    pjVar2->msg_code = 0x1b;
    (pjVar2->msg_parm).i[0] = iVar3;
    (dstinfo->err->msg_parm).i[1] = 10;
    (*dstinfo->err->error_exit)((j_common_ptr)dstinfo);
  }
  if (0 < dstinfo->num_components) {
    pjVar6 = dstinfo->comp_info;
    pjVar8 = srcinfo->comp_info;
    iVar3 = 0;
    do {
      pjVar6->component_id = pjVar8->component_id;
      pjVar6->h_samp_factor = pjVar8->h_samp_factor;
      pjVar6->v_samp_factor = pjVar8->v_samp_factor;
      uVar1 = pjVar8->quant_tbl_no;
      pjVar6->quant_tbl_no = uVar1;
      if ((3 < (ulong)uVar1) || (srcinfo->quant_tbl_ptrs[uVar1] == (JQUANT_TBL *)0x0)) {
        pjVar2 = dstinfo->err;
        pjVar2->msg_code = 0x36;
        (pjVar2->msg_parm).i[0] = uVar1;
        (*dstinfo->err->error_exit)((j_common_ptr)dstinfo);
      }
      pJVar4 = pjVar8->quant_table;
      if (pJVar4 != (JQUANT_TBL *)0x0) {
        pJVar7 = srcinfo->quant_tbl_ptrs[(int)uVar1];
        lVar9 = 0;
        do {
          if (pJVar4->quantval[lVar9] != pJVar7->quantval[lVar9]) {
            pjVar2 = dstinfo->err;
            pjVar2->msg_code = 0x2d;
            (pjVar2->msg_parm).i[0] = uVar1;
            (*dstinfo->err->error_exit)((j_common_ptr)dstinfo);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x40);
      }
      iVar3 = iVar3 + 1;
      pjVar8 = pjVar8 + 1;
      pjVar6 = pjVar6 + 1;
    } while (iVar3 < dstinfo->num_components);
  }
  if (srcinfo->saw_JFIF_marker != 0) {
    if (srcinfo->JFIF_major_version == '\x01') {
      dstinfo->JFIF_major_version = '\x01';
      dstinfo->JFIF_minor_version = srcinfo->JFIF_minor_version;
    }
    dstinfo->density_unit = srcinfo->density_unit;
    dstinfo->X_density = srcinfo->X_density;
    dstinfo->Y_density = srcinfo->Y_density;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_copy_critical_parameters (j_decompress_ptr srcinfo,
			       j_compress_ptr dstinfo)
{
  JQUANT_TBL ** qtblptr;
  jpeg_component_info *incomp, *outcomp;
  JQUANT_TBL *c_quant, *slot_quant;
  int tblno, ci, coefi;

  /* Safety check to ensure start_compress not called yet. */
  if (dstinfo->global_state != CSTATE_START)
    ERREXIT1(dstinfo, JERR_BAD_STATE, dstinfo->global_state);
  /* Copy fundamental image dimensions */
  dstinfo->image_width = srcinfo->image_width;
  dstinfo->image_height = srcinfo->image_height;
  dstinfo->input_components = srcinfo->num_components;
  dstinfo->in_color_space = srcinfo->jpeg_color_space;
  dstinfo->jpeg_width = srcinfo->output_width;
  dstinfo->jpeg_height = srcinfo->output_height;
  dstinfo->min_DCT_h_scaled_size = srcinfo->min_DCT_h_scaled_size;
  dstinfo->min_DCT_v_scaled_size = srcinfo->min_DCT_v_scaled_size;
  /* Initialize all parameters to default values */
  jpeg_set_defaults(dstinfo);
  /* jpeg_set_defaults may choose wrong colorspace, eg YCbCr if input is RGB.
   * Fix it to get the right header markers for the image colorspace.
   */
  jpeg_set_colorspace(dstinfo, srcinfo->jpeg_color_space);
  dstinfo->data_precision = srcinfo->data_precision;
  dstinfo->CCIR601_sampling = srcinfo->CCIR601_sampling;
  /* Copy the source's quantization tables. */
  for (tblno = 0; tblno < NUM_QUANT_TBLS; tblno++) {
    if (srcinfo->quant_tbl_ptrs[tblno] != NULL) {
      qtblptr = & dstinfo->quant_tbl_ptrs[tblno];
      if (*qtblptr == NULL)
	*qtblptr = jpeg_alloc_quant_table((j_common_ptr) dstinfo);
      MEMCOPY((*qtblptr)->quantval,
	      srcinfo->quant_tbl_ptrs[tblno]->quantval,
	      SIZEOF((*qtblptr)->quantval));
      (*qtblptr)->sent_table = FALSE;
    }
  }
  /* Copy the source's per-component info.
   * Note we assume jpeg_set_defaults has allocated the dest comp_info array.
   */
  dstinfo->num_components = srcinfo->num_components;
  if (dstinfo->num_components < 1 || dstinfo->num_components > MAX_COMPONENTS)
    ERREXIT2(dstinfo, JERR_COMPONENT_COUNT, dstinfo->num_components,
	     MAX_COMPONENTS);
  for (ci = 0, incomp = srcinfo->comp_info, outcomp = dstinfo->comp_info;
       ci < dstinfo->num_components; ci++, incomp++, outcomp++) {
    outcomp->component_id = incomp->component_id;
    outcomp->h_samp_factor = incomp->h_samp_factor;
    outcomp->v_samp_factor = incomp->v_samp_factor;
    outcomp->quant_tbl_no = incomp->quant_tbl_no;
    /* Make sure saved quantization table for component matches the qtable
     * slot.  If not, the input file re-used this qtable slot.
     * IJG encoder currently cannot duplicate this.
     */
    tblno = outcomp->quant_tbl_no;
    if (tblno < 0 || tblno >= NUM_QUANT_TBLS ||
	srcinfo->quant_tbl_ptrs[tblno] == NULL)
      ERREXIT1(dstinfo, JERR_NO_QUANT_TABLE, tblno);
    slot_quant = srcinfo->quant_tbl_ptrs[tblno];
    c_quant = incomp->quant_table;
    if (c_quant != NULL) {
      for (coefi = 0; coefi < DCTSIZE2; coefi++) {
	if (c_quant->quantval[coefi] != slot_quant->quantval[coefi])
	  ERREXIT1(dstinfo, JERR_MISMATCHED_QUANT_TABLE, tblno);
      }
    }
    /* Note: we do not copy the source's Huffman table assignments;
     * instead we rely on jpeg_set_colorspace to have made a suitable choice.
     */
  }
  /* Also copy JFIF version and resolution information, if available.
   * Strictly speaking this isn't "critical" info, but it's nearly
   * always appropriate to copy it if available.  In particular,
   * if the application chooses to copy JFIF 1.02 extension markers from
   * the source file, we need to copy the version to make sure we don't
   * emit a file that has 1.02 extensions but a claimed version of 1.01.
   * We will *not*, however, copy version info from mislabeled "2.01" files.
   */
  if (srcinfo->saw_JFIF_marker) {
    if (srcinfo->JFIF_major_version == 1) {
      dstinfo->JFIF_major_version = srcinfo->JFIF_major_version;
      dstinfo->JFIF_minor_version = srcinfo->JFIF_minor_version;
    }
    dstinfo->density_unit = srcinfo->density_unit;
    dstinfo->X_density = srcinfo->X_density;
    dstinfo->Y_density = srcinfo->Y_density;
  }
}